

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_primitives.c
# Opt level: O2

void al_draw_rounded_rectangle
               (float x1,float y1,float x2,float y2,float rx,float ry,ALLEGRO_COLOR color,
               float thickness)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int type;
  undefined1 auVar6 [16];
  uint uVar7;
  long lVar8;
  ALLEGRO_VERTEX *pAVar9;
  float *pfVar10;
  long lVar11;
  uint num_points;
  ALLEGRO_VERTEX *dest;
  long lVar12;
  long lVar13;
  int end;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined4 in_XMM6_Dc;
  undefined4 in_XMM6_Dd;
  ALLEGRO_COLOR color_00;
  float fStack_2440;
  undefined1 auStack_243c [20];
  undefined1 local_2428 [16];
  ALLEGRO_VERTEX vertex_cache [256];
  
  auStack_243c._4_8_ = color._8_8_;
  local_2428._8_4_ = in_XMM6_Dc;
  local_2428._0_8_ = color._0_8_;
  local_2428._12_4_ = in_XMM6_Dd;
  fVar18 = get_scale();
  fVar19 = (rx + ry) * 0.5;
  if (fVar19 < 0.0) {
    fVar19 = sqrtf(fVar19);
  }
  else {
    fVar19 = SQRT(fVar19);
  }
  auVar6 = local_2428;
  uVar7 = (uint)(fVar18 * 10.0 * fVar19 * 0.25);
  if (thickness <= 0.0) {
    if ((int)uVar7 < 2) goto LAB_00106c7a;
    uVar16 = 0x3f;
    if (uVar7 < 0x3f) {
      uVar16 = (ulong)uVar7;
    }
    dest = vertex_cache;
    al_calculate_arc(&dest->x,0x24,0.0,0.0,rx,ry,0.0,1.5707964,0.0,(int)uVar16 + 1);
    pAVar9 = dest + uVar16;
    uVar15 = uVar16;
    while( true ) {
      pAVar9 = pAVar9 + -1;
      bVar17 = uVar15 == 0;
      uVar15 = uVar15 - 1;
      if (bVar17) break;
      uVar1 = pAVar9->x;
      uVar4 = pAVar9->y;
      dest[uVar16].x = (x1 + rx) - (float)uVar1;
      dest[uVar16].y = (y1 + ry) - (float)uVar4;
      dest[uVar16 * 2].x = (x1 + rx) - dest->x;
      dest[uVar16 * 2].y = dest->y + (y2 - ry);
      uVar2 = pAVar9->x;
      uVar5 = pAVar9->y;
      dest[uVar16 * 3].x = (float)uVar2 + (x2 - rx);
      dest[uVar16 * 3].y = (float)uVar5 + (y2 - ry);
      dest = dest + 1;
    }
    for (lVar11 = 0; uVar16 * 0x24 - lVar11 != 0; lVar11 = lVar11 + 0x24) {
      *(float *)((long)&vertex_cache[0].x + lVar11) =
           *(float *)((long)&vertex_cache[0].x + lVar11) + (x2 - rx);
      *(float *)((long)&vertex_cache[0].y + lVar11) =
           (y1 + ry) - *(float *)((long)&vertex_cache[0].y + lVar11);
    }
    end = (int)uVar16 * 4;
    for (lVar11 = 0; uVar16 * 0x90 - lVar11 != 0; lVar11 = lVar11 + 0x24) {
      *(undefined4 *)((long)&vertex_cache[0].color.r + lVar11) = local_2428._0_4_;
      *(undefined4 *)((long)&vertex_cache[0].color.g + lVar11) = local_2428._4_4_;
      *(int *)((long)&vertex_cache[0].color.b + lVar11) = (int)auStack_243c._4_8_;
      *(int *)((long)&vertex_cache[0].color.a + lVar11) = SUB84(auStack_243c._4_8_,4);
      *(undefined4 *)((long)&vertex_cache[0].z + lVar11) = 0;
    }
    type = 2;
  }
  else {
    if ((int)uVar7 < 2) {
LAB_00106c7a:
      color_00.b = (float)auStack_243c._4_4_;
      color_00.a = (float)auStack_243c._8_4_;
      color_00.r = (float)local_2428._0_4_;
      color_00.g = (float)local_2428._4_4_;
      local_2428 = auVar6;
      al_draw_rectangle(x1,y1,x2,y2,color_00,thickness);
      return;
    }
    num_points = 0x1f;
    if ((int)(uVar7 * 8 + 2) < 0x100) {
      num_points = uVar7;
    }
    al_calculate_arc(&vertex_cache[0].x,0x24,0.0,0.0,rx,ry,0.0,1.5707964,thickness,num_points);
    uVar16 = (ulong)(num_points * 2);
    fVar20 = x1 + rx;
    fVar21 = y1 + ry;
    fVar18 = x2 - rx;
    fVar19 = y2 - ry;
    lVar8 = uVar16 * 0x24;
    lVar11 = lVar8 + -0x24;
    lVar12 = (ulong)(num_points * 4) * 0x24 + 0x28;
    lVar13 = (ulong)(num_points * 6) * 0x24;
    lVar14 = 0x28;
    for (uVar15 = 0; uVar15 < uVar16; uVar15 = uVar15 + 2) {
      uVar3 = *(undefined8 *)((long)&vertex_cache[0].x + lVar11);
      *(ulong *)((long)&vertex_cache[1].x + lVar8) =
           CONCAT44(fVar21 - (float)((ulong)uVar3 >> 0x20),fVar20 - (float)uVar3);
      *(ulong *)((long)&vertex_cache[0].x + lVar8) =
           CONCAT44(fVar21 - (float)((ulong)*(undefined8 *)(auStack_243c + lVar11) >> 0x20),
                    fVar20 - (float)*(undefined8 *)(auStack_243c + lVar11));
      *(float *)((long)&fStack_2440 + lVar12) = fVar20 - *(float *)((long)&fStack_2440 + lVar14);
      *(float *)(auStack_243c + lVar12) = *(float *)(auStack_243c + lVar14) + fVar19;
      *(float *)(local_2428 + lVar12 + 0xc) = fVar20 - *(float *)(local_2428 + lVar14 + 0xc);
      *(float *)((long)&vertex_cache[0].x + lVar12) =
           *(float *)((long)&vertex_cache[0].x + lVar14) + fVar19;
      uVar3 = *(undefined8 *)((long)&vertex_cache[0].x + lVar11);
      *(ulong *)((long)&vertex_cache[1].x + lVar13) =
           CONCAT44((float)((ulong)uVar3 >> 0x20) + fVar19,(float)uVar3 + fVar18);
      *(ulong *)((long)&vertex_cache[0].x + lVar13) =
           CONCAT44((float)((ulong)*(undefined8 *)(auStack_243c + lVar11) >> 0x20) + fVar19,
                    (float)*(undefined8 *)(auStack_243c + lVar11) + fVar18);
      lVar14 = lVar14 + 0x48;
      lVar11 = lVar11 + -0x48;
      lVar8 = lVar8 + 0x48;
      lVar12 = lVar12 + 0x48;
      lVar13 = lVar13 + 0x48;
    }
    pfVar10 = &vertex_cache[1].y;
    for (uVar15 = 0; uVar15 < uVar16; uVar15 = uVar15 + 2) {
      pfVar10[-10] = pfVar10[-10] + fVar18;
      pfVar10[-9] = fVar21 - pfVar10[-9];
      ((ALLEGRO_VERTEX *)(pfVar10 + -1))->x = ((ALLEGRO_VERTEX *)(pfVar10 + -1))->x + fVar18;
      *pfVar10 = fVar21 - *pfVar10;
      pfVar10 = pfVar10 + 0x12;
    }
    uVar16 = (ulong)(num_points * 8);
    vertex_cache[uVar16].color.a = vertex_cache[0].color.a;
    vertex_cache[uVar16].v = vertex_cache[0].v;
    vertex_cache[uVar16].color.r = vertex_cache[0].color.r;
    vertex_cache[uVar16].color.g = vertex_cache[0].color.g;
    vertex_cache[uVar16].color.b = vertex_cache[0].color.b;
    vertex_cache[uVar16].x = vertex_cache[0].x;
    vertex_cache[uVar16].y = vertex_cache[0].y;
    vertex_cache[uVar16].z = vertex_cache[0].z;
    vertex_cache[uVar16].u = vertex_cache[0].u;
    uVar7 = num_points * 8 + 1;
    vertex_cache[uVar7].color.a = vertex_cache[1].color.a;
    vertex_cache[uVar7].v = vertex_cache[1].v;
    vertex_cache[uVar7].color.r = vertex_cache[1].color.r;
    vertex_cache[uVar7].color.g = vertex_cache[1].color.g;
    vertex_cache[uVar7].color.b = vertex_cache[1].color.b;
    vertex_cache[uVar7].x = vertex_cache[1].x;
    vertex_cache[uVar7].y = vertex_cache[1].y;
    vertex_cache[uVar7].z = vertex_cache[1].z;
    vertex_cache[uVar7].u = vertex_cache[1].u;
    end = num_points * 8 + 2;
    for (lVar11 = 0; uVar16 * 0x24 + 0x48 != lVar11; lVar11 = lVar11 + 0x24) {
      *(undefined4 *)((long)&vertex_cache[0].color.r + lVar11) = local_2428._0_4_;
      *(undefined4 *)((long)&vertex_cache[0].color.g + lVar11) = local_2428._4_4_;
      *(int *)((long)&vertex_cache[0].color.b + lVar11) = (int)auStack_243c._4_8_;
      *(int *)((long)&vertex_cache[0].color.a + lVar11) = SUB84(auStack_243c._4_8_,4);
      *(undefined4 *)((long)&vertex_cache[0].z + lVar11) = 0;
    }
    type = 4;
  }
  al_draw_prim(vertex_cache,(ALLEGRO_VERTEX_DECL *)0x0,(ALLEGRO_BITMAP *)0x0,0,end,type);
  return;
}

Assistant:

void al_draw_rounded_rectangle(float x1, float y1, float x2, float y2,
   float rx, float ry, ALLEGRO_COLOR color, float thickness)
{
   LOCAL_VERTEX_CACHE;
   float scale = get_scale();

   ASSERT(rx >= 0);
   ASSERT(ry >= 0);

   if (thickness > 0) {
      int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;
      int ii;

      /* In case rx and ry are both 0. */
      if (num_segments < 2) {
         al_draw_rectangle(x1, y1, x2, y2, color, thickness);
         return;
      }

      if (8 * num_segments + 2 >= ALLEGRO_VERTEX_CACHE_SIZE) {
         num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 3) / 8;
      }
      
      al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, thickness, num_segments);
      
      for (ii = 0; ii < 2 * num_segments; ii += 2) {
         vertex_cache[ii + 2 * num_segments + 1].x = x1 + rx - vertex_cache[2 * num_segments - 1 - ii].x;
         vertex_cache[ii + 2 * num_segments + 1].y = y1 + ry - vertex_cache[2 * num_segments - 1 - ii].y;
         vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[2 * num_segments - 1 - ii - 1].x;
         vertex_cache[ii + 2 * num_segments].y = y1 + ry - vertex_cache[2 * num_segments - 1 - ii - 1].y;

         vertex_cache[ii + 4 * num_segments].x = x1 + rx - vertex_cache[ii].x;
         vertex_cache[ii + 4 * num_segments].y = y2 - ry + vertex_cache[ii].y;
         vertex_cache[ii + 4 * num_segments + 1].x = x1 + rx - vertex_cache[ii + 1].x;
         vertex_cache[ii + 4 * num_segments + 1].y = y2 - ry + vertex_cache[ii + 1].y;

         vertex_cache[ii + 6 * num_segments + 1].x = x2 - rx + vertex_cache[2 * num_segments - 1 - ii].x;
         vertex_cache[ii + 6 * num_segments + 1].y = y2 - ry + vertex_cache[2 * num_segments - 1 - ii].y;
         vertex_cache[ii + 6 * num_segments].x = x2 - rx + vertex_cache[2 * num_segments - 1 - ii - 1].x;
         vertex_cache[ii + 6 * num_segments].y = y2 - ry + vertex_cache[2 * num_segments - 1 - ii - 1].y;
      }
      for (ii = 0; ii < 2 * num_segments; ii += 2) {
         vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
         vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
         vertex_cache[ii + 1].x = x2 - rx + vertex_cache[ii + 1].x;
         vertex_cache[ii + 1].y = y1 + ry - vertex_cache[ii + 1].y;
      }
      vertex_cache[8 * num_segments] = vertex_cache[0];
      vertex_cache[8 * num_segments + 1] = vertex_cache[1];

      for (ii = 0; ii < 8 * num_segments + 2; ii++) {
         vertex_cache[ii].color = color;
         vertex_cache[ii].z = 0;
      }
         
      al_draw_prim(vertex_cache, 0, 0, 0, 8 * num_segments + 2, ALLEGRO_PRIM_TRIANGLE_STRIP);
   } else {
      int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;
      int ii;
      
      /* In case rx and ry are both 0. */
      if (num_segments < 2) {
         al_draw_rectangle(x1, y1, x2, y2, color, thickness);
         return;
      }

      if (num_segments * 4 >= ALLEGRO_VERTEX_CACHE_SIZE) {
         num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 1) / 4;
      }
      
      al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, 0, num_segments + 1);

      for (ii = 0; ii < num_segments; ii++) {
         vertex_cache[ii + 1 * num_segments].x = x1 + rx - vertex_cache[num_segments - 1 - ii].x;
         vertex_cache[ii + 1 * num_segments].y = y1 + ry - vertex_cache[num_segments - 1 - ii].y;

         vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[ii].x;
         vertex_cache[ii + 2 * num_segments].y = y2 - ry + vertex_cache[ii].y;

         vertex_cache[ii + 3 * num_segments].x = x2 - rx + vertex_cache[num_segments - 1 - ii].x;
         vertex_cache[ii + 3 * num_segments].y = y2 - ry + vertex_cache[num_segments - 1 - ii].y;
      }
      for (ii = 0; ii < num_segments; ii++) {
         vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
         vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
      }

      for (ii = 0; ii < 4 * num_segments; ii++) {
         vertex_cache[ii].color = color;
         vertex_cache[ii].z = 0;
      }
         
      al_draw_prim(vertex_cache, 0, 0, 0, 4 * num_segments, ALLEGRO_PRIM_LINE_LOOP);
   }
}